

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyramid.cpp
# Opt level: O0

void __thiscall vera::Pyramid::allocate(Pyramid *this,int _width,int _height)

{
  int *piVar1;
  uint *puVar2;
  double dVar3;
  uint local_2c;
  uint local_28;
  uint i_1;
  uint i;
  float h;
  float w;
  int local_14;
  int _height_local;
  int _width_local;
  Pyramid *this_local;
  
  w = (float)_height;
  local_14 = _width;
  __height_local = this;
  piVar1 = std::min<int>(&local_14,(int *)&w);
  dVar3 = log2((double)*piVar1);
  this->m_depth = (uint)(long)(dVar3 + -1.0);
  h = 1.68156e-44;
  puVar2 = std::min<unsigned_int>((uint *)&h,&this->m_depth);
  this->m_depth = *puVar2;
  this->m_width = local_14;
  this->m_height = (int)w;
  i = (uint)(float)local_14;
  i_1 = (uint)(float)(int)w;
  for (local_28 = 0; local_28 < this->m_depth; local_28 = local_28 + 1) {
    i = (uint)((float)i * 0.5);
    i_1 = (uint)((float)i_1 * 0.5);
    (*this->m_downs[local_28]._vptr_Fbo[2])
              (this->m_downs + local_28,(long)(float)i & 0xffffffff,(long)(float)i_1 & 0xffffffff,2,
               1,1,1);
  }
  for (local_2c = 0; local_2c < this->m_depth; local_2c = local_2c + 1) {
    i = (uint)((float)i + (float)i);
    i_1 = (uint)((float)i_1 + (float)i_1);
    (*this->m_ups[local_2c]._vptr_Fbo[2])
              (this->m_ups + local_2c,(long)(float)i & 0xffffffff,(long)(float)i_1 & 0xffffffff,2,1,
               1,1);
  }
  return;
}

Assistant:

void Pyramid::allocate(int _width, int _height) {
    m_depth = log2(std::min(_width, _height)) - 1;
    m_depth = std::min((unsigned int)PYRAMID_MAX_LAYERS, m_depth);

    m_width = _width;
    m_height = _height;

    float w = _width;
    float h = _height;

    for (unsigned int i = 0; i < m_depth; i++) {
        w *= 0.5f;
        h *= 0.5f;
        m_downs[i].allocate(w, h, vera::COLOR_FLOAT_TEXTURE, vera::TextureFilter::NEAREST, vera::TextureWrap::CLAMP);
    }
    
    for (unsigned int i = 0; i < m_depth; i++) {
        w *= 2.0f;
        h *= 2.0f;
        m_ups[i].allocate(w, h, vera::COLOR_FLOAT_TEXTURE, vera::TextureFilter::NEAREST, vera::TextureWrap::CLAMP);
    }
}